

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O3

string * __thiscall
flatbuffers::IdlNamer::NamespacedString
          (string *__return_storage_ptr__,IdlNamer *this,Namespace *ns,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40 [2];
  long local_30 [2];
  
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  if (ns != (Namespace *)0x0) {
    (*(this->super_Namer)._vptr_Namer[10])(local_40);
    std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    if (local_60._M_string_length != 0) {
      std::__cxx11::string::_M_append
                ((char *)&local_60,
                 (ulong)(this->super_Namer).config_.namespace_seperator._M_dataplus._M_p);
    }
  }
  std::operator+(__return_storage_ptr__,&local_60,str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedString(const struct Namespace *ns,
                               const std::string &str) const {
    std::string ret;
    if (ns != nullptr) { ret += Namespace(ns->components); }
    if (!ret.empty()) ret += config_.namespace_seperator;
    return ret + str;
  }